

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall spvtools::opt::analysis::Image::IsSameImpl(Image *this,Type *that,IsSameCache *seen)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  bool local_39;
  Image *it;
  IsSameCache *seen_local;
  Type *that_local;
  Image *this_local;
  long lVar3;
  
  iVar1 = (*that->_vptr_Type[0x12])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_39 = false;
    if ((((this->dim_ == *(Dim *)(lVar3 + 0x30)) &&
         (local_39 = false, this->depth_ == *(uint32_t *)(lVar3 + 0x34))) &&
        (local_39 = false, (this->arrayed_ & 1U) == (*(byte *)(lVar3 + 0x38) & 1))) &&
       (((local_39 = false, (this->ms_ & 1U) == (*(byte *)(lVar3 + 0x39) & 1) &&
         (local_39 = false, this->sampled_ == *(uint32_t *)(lVar3 + 0x3c))) &&
        ((local_39 = false, this->format_ == *(ImageFormat *)(lVar3 + 0x40) &&
         (local_39 = false, this->access_qualifier_ == *(AccessQualifier *)(lVar3 + 0x44))))))) {
      uVar2 = (*this->sampled_type_->_vptr_Type[2])
                        (this->sampled_type_,*(undefined8 *)(lVar3 + 0x28),seen);
      local_39 = false;
      if ((uVar2 & 1) != 0) {
        local_39 = Type::HasSameDecorations(&this->super_Type,that);
      }
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool Image::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Image* it = that->AsImage();
  if (!it) return false;
  return dim_ == it->dim_ && depth_ == it->depth_ && arrayed_ == it->arrayed_ &&
         ms_ == it->ms_ && sampled_ == it->sampled_ && format_ == it->format_ &&
         access_qualifier_ == it->access_qualifier_ &&
         sampled_type_->IsSameImpl(it->sampled_type_, seen) &&
         HasSameDecorations(that);
}